

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O3

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,Vector *xh0,Matrix *p,Matrix *q,Matrix *r,double dt)

{
  examples *peVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  IndexedMatrixArray u;
  assign_op<double,_double> local_e9;
  Matrix *local_e8;
  Vector *local_e0;
  Matrix *local_d8;
  Matrix *local_d0;
  double local_c8;
  examples *local_c0;
  uint local_b8 [2];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_b0 [16];
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_68;
  undefined8 local_60 [2];
  undefined8 local_50;
  void *local_48 [3];
  
  local_e8 = r;
  local_e0 = xh0;
  local_d8 = p;
  local_d0 = q;
  local_c8 = dt;
  local_c0 = this;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_b8);
  lVar3 = *(long *)(y + 0x50);
  lVar5 = *(long *)(y + 0x30);
  lVar6 = *(long *)(y + 0x38);
  lVar8 = *(long *)(y + 0x40);
  lVar2 = *(long *)(y + 0x28);
  lVar10 = *(long *)(y + 0x18);
  iVar9 = *(int *)y;
  uVar11 = 0xffffffff;
  if ((lVar6 - lVar8 >> 3) * -0x5555555555555555 +
      ((lVar3 - lVar5 >> 3) + -1 + (ulong)(lVar3 == 0)) * 0x15 !=
      (lVar2 - lVar10 >> 3) * 0x5555555555555555) {
    uVar11 = (ulong)(iVar9 - 1);
  }
  do {
    peVar1 = local_c0;
    lVar3 = (lVar2 - lVar10 >> 3) * -0x5555555555555555 + (lVar6 - lVar8 >> 3) * -0x5555555555555555
            + ((lVar3 - lVar5 >> 3) + -1 + (ulong)(lVar3 == 0)) * 0x15;
    if ((lVar3 == 0) || ((iVar9 + (int)lVar3) - 1 <= uVar11)) {
      imuAttitudeTrajectoryReconstruction
                (local_c0,y,(IndexedMatrixArray *)local_b8,local_e0,local_d8,local_d0,local_e8,
                 local_c8);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque(local_b0);
      return peVar1;
    }
    local_60[0] = 6;
    local_50 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_48,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_60);
    lVar3 = (local_80 - local_78 >> 3) * -0x5555555555555555 +
            ((local_68 - local_88 >> 3) + -1 + (ulong)(local_68 == 0)) * 0x15;
    lVar5 = local_90 - local_a0 >> 3;
    lVar6 = lVar5 * -0x5555555555555555 + lVar3;
    if (lVar6 == 0) {
LAB_0010762f:
      if (lVar3 == lVar5 * 0x5555555555555555) {
        local_b8[0] = (uint)uVar11;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(local_b0,(value_type *)local_48);
    }
    else {
      uVar7 = lVar6 + (ulong)local_b8[0];
      if ((uVar11 < local_b8[0]) || (uVar7 <= uVar11)) {
        if (uVar11 != uVar7) {
          __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0xaa,
                        "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const")
          ;
        }
        goto LAB_0010762f;
      }
      uVar7 = (ulong)((uint)uVar11 - local_b8[0]);
      uVar4 = (local_a0 - local_98 >> 3) * -0x5555555555555555 + uVar7;
      if ((long)uVar4 < 0) {
        uVar7 = ~(~uVar4 / 0x15);
LAB_00107694:
        lVar3 = uVar7 * -0x1f8 + *(long *)(local_88 + uVar7 * 8);
        uVar7 = uVar4;
      }
      else {
        lVar3 = local_a0;
        if (0x14 < uVar4) {
          uVar7 = uVar4 / 0x15;
          goto LAB_00107694;
        }
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar3 + uVar7 * 0x18),
                 (Matrix<double,__1,__1,_0,__1,__1> *)local_48,&local_e9);
    }
    free(local_48[0]);
    uVar11 = uVar11 + 1;
    lVar3 = *(long *)(y + 0x50);
    lVar5 = *(long *)(y + 0x30);
    lVar6 = *(long *)(y + 0x38);
    lVar8 = *(long *)(y + 0x40);
    lVar2 = *(long *)(y + 0x28);
    lVar10 = *(long *)(y + 0x18);
    iVar9 = *(int *)y;
  } while( true );
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction(
    const IndexedMatrixArray & y,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    const unsigned inputSize=6;

    ///initialization of a zero input
    IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return imuAttitudeTrajectoryReconstruction (y, u, xh0, p, q, r, dt);
}